

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

void polymul_internal::polynomial_multiplier<double,_3,_1,_4>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  int iVar1;
  int iVar2;
  double *m2_local;
  double *p1_local;
  double *dst_local;
  
  iVar1 = binomial(7,4);
  iVar2 = binomial(3,0);
  polynomial_multiplier<double,_2,_1,_4>::mul(dst + iVar1,p1 + iVar2,m2);
  polynomial_multiplier<double,_3,_0,_4>::mul_monomial(dst,p1,m2);
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    polynomial_multiplier<numtype, Nvar - 1, Ndeg1, Ndeg2>::mul(
        dst + binomial(Nvar + Ndeg1 + Ndeg2 - 1, Ndeg1 + Ndeg2 - 1),
        p1 + binomial(Nvar + Ndeg1 - 1, Ndeg1 - 1),
        m2);
    polynomial_multiplier<numtype, Nvar, Ndeg1 - 1, Ndeg2>::mul_monomial(
        dst, p1, m2);
  }